

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

sz_sock __thiscall sznet::net::Connector::removeAndResetChannel(Connector *this)

{
  EventLoop *this_00;
  pointer pCVar1;
  char *in_RSI;
  unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_> *this_01;
  Connector *local_68;
  code *local_60;
  undefined8 local_58;
  type local_50;
  Functor local_38;
  sz_fd local_14;
  Connector *pCStack_10;
  sz_sock sockfd;
  Connector *this_local;
  
  this_01 = &this->m_channel;
  pCStack_10 = this;
  pCVar1 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
           operator->(this_01);
  Channel::disableAll(pCVar1);
  pCVar1 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
           operator->(this_01);
  Channel::remove(pCVar1,in_RSI);
  pCVar1 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
           operator->(this_01);
  local_14 = Channel::fd(pCVar1);
  this_00 = this->m_loop;
  local_60 = resetChannel;
  local_58 = 0;
  local_68 = this;
  std::bind<void(sznet::net::Connector::*)(),sznet::net::Connector*>
            (&local_50,(offset_in_Connector_to_subr *)&local_60,&local_68);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::Connector::*(sznet::net::Connector*))()>,void>
            ((function<void()> *)&local_38,&local_50);
  EventLoop::queueInLoop(this_00,&local_38);
  std::function<void_()>::~function(&local_38);
  return local_14;
}

Assistant:

sockets::sz_sock Connector::removeAndResetChannel()
{
	m_channel->disableAll();
	m_channel->remove();
	sockets::sz_sock sockfd = m_channel->fd();
	// Can't reset m_channel here, because we are inside Channel::handleEvent
	// FIXME: unsafe
	m_loop->queueInLoop(std::bind(&Connector::resetChannel, this));
	return sockfd;
}